

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

bool TestAllRecoveryData(WirehairCodec encoder,WirehairCodec decoder,uint N,uint blockBytes,
                        uint finalBytes,uint8_t *message,uint8_t *decodedMessage,uint messageBytes)

{
  bool bVar1;
  WirehairResult outBytes;
  WirehairResult WVar2;
  uint finalBytes_00;
  uint uVar3;
  ostream *poVar4;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RDI;
  int in_R8D;
  undefined8 in_R9;
  WirehairResult decodeResult_1;
  WirehairResult encodeResult_1;
  uint32_t writeLen;
  uint blockId;
  WirehairResult decodeResult;
  WirehairResult encodeResult;
  uint32_t Nm1Len;
  uint needed;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar6;
  uint32_t in_stack_ffffffffffffffc4;
  int iVar7;
  int iVar8;
  undefined4 in_stack_ffffffffffffffd8;
  uint messageBytes_00;
  
  iVar8 = 0;
  iVar7 = 0;
  outBytes = wirehair_encode((WirehairCodec)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                             (uint)((ulong)in_R9 >> 0x20),(void *)0x0,in_stack_ffffffffffffffc4,
                             (uint32_t *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (outBytes == Wirehair_Success) {
    if (iVar7 == in_R8D) {
      WVar2 = wirehair_decode((WirehairCodec)CONCAT44(iVar8,iVar7),0,
                              (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              in_stack_ffffffffffffffb4);
      if (WVar2 == Wirehair_NeedMore) {
        finalBytes_00 = iVar8 + 1;
        uVar6 = 1;
        uVar3 = in_EDX;
        while( true ) {
          finalBytes_00 = finalBytes_00 + 1;
          uVar5 = 0;
          WVar2 = wirehair_encode((WirehairCodec)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                                  (uint)((ulong)in_R9 >> 0x20),(void *)CONCAT44(finalBytes_00,iVar7)
                                  ,outBytes,(uint32_t *)((ulong)uVar3 << 0x20));
          if (WVar2 != Wirehair_Success) break;
          if (uVar5 != in_ECX) {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "wirehair_encode failed wrong len for N-1 and N = ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            return false;
          }
          WVar2 = wirehair_decode((WirehairCodec)CONCAT44(finalBytes_00,iVar7),outBytes,
                                  (void *)CONCAT44(uVar3,uVar5),0);
          messageBytes_00 = (uint)in_RDI;
          if (WVar2 != Wirehair_NeedMore) {
            if (WVar2 != Wirehair_Success) {
              poVar4 = std::operator<<((ostream *)&std::cout,"wirehair_decode failed for ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
              poVar4 = std::operator<<(poVar4," and N = ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              return false;
            }
            if (in_EDX + 4 <= finalBytes_00) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "TestAllRecoveryData: Too much overhead: ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,finalBytes_00 - in_EDX);
              poVar4 = std::operator<<(poVar4," extra for N=");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
              poVar4 = std::operator<<(poVar4," Seed=n/a BlockBytes=");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ECX);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            bVar1 = DoesCodecProduceOriginals
                              ((WirehairCodec)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                               (uint)((ulong)in_R9 >> 0x20),(uint)in_R9,finalBytes_00,
                               (uint8_t *)CONCAT44(outBytes,uVar6),(uint8_t *)CONCAT44(uVar3,uVar5),
                               messageBytes_00);
            if (!bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "!! Decoder2 failed to produce originals");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              return false;
            }
            return true;
          }
          uVar3 = uVar3 + 1;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"wirehair_encode failed for N = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"wirehair_decode failed for N-1 and N = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "wirehair_encode failed wrong len for N-1 and N = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"wirehair_encode failed for N-1 and N = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_EDX);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return false;
}

Assistant:

static bool TestAllRecoveryData(
    WirehairCodec encoder,
    WirehairCodec decoder,
    unsigned N,
    unsigned blockBytes,
    unsigned finalBytes,
    const uint8_t* message,
    uint8_t* decodedMessage,
    unsigned messageBytes)
{
    unsigned needed = 0;

#ifdef ENABLE_ALL_RECOVERY_FINAL_BLOCK
    // Check the special case final block:
    {
        uint32_t Nm1Len = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, N - 1, decodedMessage, blockBytes, &Nm1Len);

        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed for N-1 and N = " << N << endl;
            return false;
        }

        if (Nm1Len != finalBytes)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed wrong len for N-1 and N = " << N << endl;
            return false;
        }

        WirehairResult decodeResult = wirehair_decode(decoder, N - 1, decodedMessage, Nm1Len);

        if (decodeResult != Wirehair_NeedMore)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_decode failed for N-1 and N = " << N << endl;
            return false;
        }

        ++needed;
    }
#endif

    for (unsigned blockId = N;; ++blockId)
    {
        ++needed;

        uint32_t writeLen = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, blockId, decodedMessage, blockBytes, &writeLen);

        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed for N = " << N << endl;
            return false;
        }

        if (writeLen != blockBytes)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed wrong len for N-1 and N = " << N << endl;
            return false;
        }

        WirehairResult decodeResult = wirehair_decode(decoder, blockId, decodedMessage, writeLen);

        if (decodeResult != Wirehair_NeedMore)
        {
            if (decodeResult == Wirehair_Success) {
                break;
            }

            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_decode failed for " << blockId << " and N = " << N << endl;
            return false;
        }
    }

    if (needed >= N + kExtraWarnThreshold) {
        //SIAMESE_DEBUG_BREAK();
        cout << "TestAllRecoveryData: Too much overhead: " << (needed - N) << " extra for N=" << N << " Seed=n/a BlockBytes=" << blockBytes << endl;
        //return false;
    }

    if (!DoesCodecProduceOriginals(decoder, N, blockBytes, finalBytes, message, decodedMessage, messageBytes))
    {
        SIAMESE_DEBUG_BREAK();
        cout << "!! Decoder2 failed to produce originals" << endl;
        return false;
    }

    return true;
}